

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void checkSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex)

{
  double dVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  Verbosity old_verbosity;
  Verbosity VVar7;
  char *pcVar8;
  data_type *pdVar9;
  data_type *pdVar10;
  ostream *poVar11;
  byte bVar12;
  longdouble lVar13;
  Rational sumviol;
  Rational rowviol;
  Rational maxviol;
  Rational boundviol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxviol_2;
  true_ local_339;
  data_type local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  ulong local_318;
  void *pvStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined5 uStack_2d0;
  undefined3 uStack_2cb;
  undefined4 uStack_2c8;
  undefined1 uStack_2c4;
  undefined8 local_2c0;
  data_type local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  ulong local_298;
  void *pvStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined5 uStack_250;
  undefined3 uStack_24b;
  undefined4 uStack_248;
  undefined1 uStack_244;
  undefined8 local_240;
  double local_238;
  double local_230;
  data_type local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  ulong local_208;
  void *pvStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined5 uStack_1c0;
  undefined3 uStack_1bb;
  undefined5 uStack_1b8;
  undefined8 local_1b0;
  data_type local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  void *pvStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined5 uStack_140;
  undefined3 uStack_13b;
  undefined4 uStack_138;
  undefined1 uStack_134;
  undefined8 local_130;
  data_type local_128;
  char local_113;
  char local_112;
  uint local_108;
  void *local_100;
  char local_f3;
  char local_f2;
  undefined4 local_b8;
  undefined1 local_b4;
  int local_b0;
  undefined4 uStack_ac;
  data_type local_a8;
  char local_93;
  char local_92;
  uint local_88;
  void *local_80;
  char local_73;
  char local_72;
  undefined4 local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  bVar12 = 0;
  iVar4 = soplex->_currentSettings->_intParamValues[0x12];
  if ((iVar4 == 2) || ((iVar4 == 1 && (soplex->_currentSettings->_intParamValues[0x10] == 1)))) {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar7 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal solution available.\n",0x1e);
        (soplex->spxout).m_verbosity = VVar7;
      }
    }
    else {
      local_1a8.la[0] = 0;
      local_198 = CONCAT17(local_198._7_1_,0x10000000001);
      local_188 = 1;
      local_178 = CONCAT17(local_178._7_1_,0x10000000001);
      local_2b8.la[0] = 0;
      local_2a8 = CONCAT17(local_2a8._7_1_,0x10000000001);
      local_298 = 1;
      local_288 = CONCAT17(local_288._7_1_,0x10000000001);
      local_338.la[0] = 0;
      local_328 = CONCAT17(local_328._7_1_,0x10000000001);
      local_318 = 1;
      local_308 = CONCAT17(local_308._7_1_,0x10000000001);
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolationRational
                        (soplex,(Rational *)&local_1a8.ld,(Rational *)&local_338.ld);
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolationRational
                          (soplex,(Rational *)&local_2b8.ld,(Rational *)&local_338.ld);
        if (!bVar3) goto LAB_004bb6cd;
        VVar7 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar7) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar4 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_1a8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_2b8.ld);
          pdVar9 = &local_2b8;
          if (0 < iVar4) {
            pdVar9 = &local_1a8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_228.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar9->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[0];
          if (NAN(dVar1)) {
            pcVar8 = "infeasible";
          }
          else {
            lVar13 = (longdouble)dVar1;
            local_128.ld.capacity = SUB104(lVar13,0);
            local_128.la[0]._4_4_ = (undefined4)((unkuint10)lVar13 >> 0x20);
            local_128.la[1]._0_2_ = (undefined2)((unkuint10)lVar13 >> 0x40);
            local_230 = dVar1;
            bVar3 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_228.ld,(longdouble *)&local_128,(true_ *)&local_a8.ld);
            pcVar8 = "feasible";
            if (bVar3) {
              pcVar8 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar11 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar5 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar8,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_228.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_128.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_f3 == '\0') && (local_f2 == '\0')) {
            operator_delete(local_100,(ulong)local_108 << 3);
          }
          if ((local_113 == '\0') && (local_112 == '\0')) {
            operator_delete((void *)CONCAT62(local_128.la[1]._2_6_,local_128.la[1]._0_2_),
                            (ulong)local_128.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar7;
          if ((local_1f8._5_1_ == '\0') && (local_1f8._6_1_ == '\0')) {
            operator_delete(pvStack_200,(local_208 & 0xffffffff) << 3);
          }
          if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
            operator_delete(local_228.ld.data,(local_228.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_004bb6cd:
        VVar7 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar7) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check primal solution.\n",0x21);
          (soplex->spxout).m_verbosity = VVar7;
        }
      }
      if ((local_308._5_1_ == '\0') && (local_308._6_1_ == '\0')) {
        operator_delete(pvStack_310,(local_318 & 0xffffffff) << 3);
      }
      if ((local_328._5_1_ == '\0') && (local_328._6_1_ == '\0')) {
        operator_delete(local_338.ld.data,(local_338.la[0] & 0xffffffff) << 3);
      }
      if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
        operator_delete(pvStack_290,(local_298 & 0xffffffff) << 3);
      }
      if ((local_2a8._5_1_ == '\0') && (local_2a8._6_1_ == '\0')) {
        operator_delete(local_2b8.ld.data,(local_2b8.la[0] & 0xffffffff) << 3);
      }
      if ((local_178._5_1_ == '\0') && (local_178._6_1_ == '\0')) {
        operator_delete(pvStack_180,(local_188 & 0xffffffff) << 3);
      }
      if ((local_198._5_1_ == '\0') && (local_198._6_1_ == '\0')) {
        operator_delete(local_1a8.ld.data,(local_1a8.la[0] & 0xffffffff) << 3);
      }
    }
    if ((soplex->_hasSolReal != false) || ((soplex->_hasSolRational & 1U) != 0)) {
      local_1a8.la[0] = 0;
      local_198 = CONCAT17(local_198._7_1_,0x10000000001);
      local_188 = 1;
      local_178 = CONCAT17(local_178._7_1_,0x10000000001);
      local_2b8.la[0] = 0;
      local_2a8 = CONCAT17(local_2a8._7_1_,0x10000000001);
      local_298 = 1;
      local_288 = CONCAT17(local_288._7_1_,0x10000000001);
      local_338.la[0] = 0;
      local_328 = CONCAT17(local_328._7_1_,0x10000000001);
      local_318 = 1;
      local_308 = CONCAT17(local_308._7_1_,0x10000000001);
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostViolationRational
                        (soplex,(Rational *)&local_1a8.ld,(Rational *)&local_338.ld);
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualViolationRational
                          (soplex,(Rational *)&local_2b8.ld,(Rational *)&local_338.ld);
        if (!bVar3) goto LAB_004bbab5;
        VVar7 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar7) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar4 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_1a8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_2b8.ld);
          pdVar9 = &local_2b8;
          if (0 < iVar4) {
            pdVar9 = &local_1a8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_228.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar9->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[1];
          if (NAN(dVar1)) {
            pcVar8 = "infeasible";
          }
          else {
            lVar13 = (longdouble)dVar1;
            local_a8.ld.capacity = SUB104(lVar13,0);
            local_a8.la[0]._4_4_ = (undefined4)((unkuint10)lVar13 >> 0x20);
            local_a8.la[1]._0_2_ = (undefined2)((unkuint10)lVar13 >> 0x40);
            local_238 = dVar1;
            bVar3 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_228.ld,(longdouble *)&local_a8,&local_339);
            pcVar8 = "feasible";
            if (bVar3) {
              pcVar8 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
          poVar11 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar5 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar8,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_a8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_228.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_a8.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_73 == '\0') && (local_72 == '\0')) {
            operator_delete(local_80,(ulong)local_88 << 3);
          }
          if ((local_93 == '\0') && (local_92 == '\0')) {
            operator_delete((void *)CONCAT62(local_a8.la[1]._2_6_,local_a8.la[1]._0_2_),
                            (ulong)local_a8.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar7;
          if ((local_1f8._5_1_ == '\0') && (local_1f8._6_1_ == '\0')) {
            operator_delete(pvStack_200,(local_208 & 0xffffffff) << 3);
          }
          if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
            operator_delete(local_228.ld.data,(local_228.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_004bbab5:
        VVar7 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar7) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check dual solution.\n",0x1f);
          (soplex->spxout).m_verbosity = VVar7;
        }
      }
      if ((local_308._5_1_ == '\0') && (local_308._6_1_ == '\0')) {
        operator_delete(pvStack_310,(local_318 & 0xffffffff) << 3);
      }
      if ((local_328._5_1_ == '\0') && (local_328._6_1_ == '\0')) {
        operator_delete(local_338.ld.data,(local_338.la[0] & 0xffffffff) << 3);
      }
      if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
        operator_delete(pvStack_290,(local_298 & 0xffffffff) << 3);
      }
      if ((local_2a8._5_1_ == '\0') && (local_2a8._6_1_ == '\0')) {
        operator_delete(local_2b8.ld.data,(local_2b8.la[0] & 0xffffffff) << 3);
      }
      if ((local_178._5_1_ == '\0') && (local_178._6_1_ == '\0')) {
        operator_delete(pvStack_180,(local_188 & 0xffffffff) << 3);
      }
      if ((local_198._5_1_ == '\0') && (local_198._6_1_ == '\0')) {
        operator_delete(local_1a8.ld.data,(local_1a8.la[0] & 0xffffffff) << 3);
      }
      VVar7 = (soplex->spxout).m_verbosity;
      goto LAB_004bc121;
    }
    VVar7 = (soplex->spxout).m_verbosity;
LAB_004bbdb3:
    if ((int)VVar7 < 3) goto LAB_004bc121;
    (soplex->spxout).m_verbosity = INFO1;
    poVar11 = (soplex->spxout).m_streams[3];
    pcVar8 = "No dual solution available.\n";
    lVar6 = 0x1c;
  }
  else {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar7 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar11 = (soplex->spxout).m_streams[3];
        pcVar8 = "No primal solution available.\n";
        lVar6 = 0x1e;
LAB_004bbd99:
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar8,lVar6);
        (soplex->spxout).m_verbosity = VVar7;
      }
    }
    else {
      local_240 = 0x1c00000000;
      local_2b8.la[0] = 0;
      local_2b8.ld.data = (limb_pointer)0x0;
      local_2a8 = 0;
      uStack_2a0 = 0;
      local_298 = 0;
      pvStack_290 = (void *)0x0;
      local_288 = 0;
      uStack_280 = 0;
      local_278 = 0;
      uStack_270 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_258 = 0;
      uStack_250 = 0;
      uStack_24b = 0;
      uStack_248 = 0;
      uStack_244 = 0;
      local_2c0 = 0x1c00000000;
      local_338.la[0] = 0;
      local_338.ld.data = (limb_pointer)0x0;
      local_328 = 0;
      uStack_320 = 0;
      local_318 = 0;
      pvStack_310 = (void *)0x0;
      local_308 = 0;
      uStack_300 = 0;
      local_2f8 = 0;
      uStack_2f0 = 0;
      local_2e8 = 0;
      uStack_2e0 = 0;
      local_2d8 = 0;
      uStack_2d0 = 0;
      uStack_2cb = 0;
      uStack_2c8 = 0;
      uStack_2c4 = 0;
      local_1b0 = 0x1c00000000;
      local_228.la[0] = 0;
      local_228.ld.data = (limb_pointer)0x0;
      local_218 = 0;
      uStack_210 = 0;
      local_208 = 0;
      pvStack_200 = (void *)0x0;
      local_1f8 = 0;
      uStack_1f0 = 0;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1d8 = 0;
      uStack_1d0 = 0;
      local_1c8 = 0;
      uStack_1c0 = 0;
      uStack_1bb = 0;
      uStack_1b8 = 0;
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_2b8.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_228.ld);
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_338.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_228.ld);
        if (bVar3) {
          VVar7 = (soplex->spxout).m_verbosity;
          if ((int)VVar7 < 3) goto LAB_004bbda1;
          (soplex->spxout).m_verbosity = INFO1;
          if ((int)local_2c0 == 2 || (int)local_240 == 2) {
LAB_004bbbe0:
            puVar2 = &local_2c0;
            pdVar9 = &local_338;
            pdVar10 = &local_128;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pdVar10->ld).capacity = (pdVar9->ld).capacity;
              pdVar9 = (data_type *)((long)pdVar9 + (ulong)bVar12 * -8 + 4);
              pdVar10 = (data_type *)((long)pdVar10 + ((ulong)bVar12 * -2 + 1) * 4);
            }
            local_b8 = uStack_2c8;
            local_b4 = uStack_2c4;
            local_b0 = (int)local_2c0;
          }
          else {
            iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)&local_2b8.ld,
                               (cpp_dec_float<200U,_int,_void> *)&local_338.ld);
            if (iVar4 < 1) {
              goto LAB_004bbbe0;
            }
            puVar2 = &local_240;
            pdVar9 = &local_2b8;
            pdVar10 = &local_128;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pdVar10->ld).capacity = (pdVar9->ld).capacity;
              pdVar9 = (data_type *)((long)pdVar9 + (ulong)bVar12 * -8 + 4);
              pdVar10 = (data_type *)((long)pdVar10 + ((ulong)bVar12 * -2 + 1) * 4);
            }
            local_b8 = uStack_248;
            local_b4 = uStack_244;
            local_b0 = (int)local_240;
          }
          uStack_ac = *(undefined4 *)((long)puVar2 + 4);
          pcVar8 = "infeasible";
          if ((local_b0 != 2) &&
             (dVar1 = soplex->_currentSettings->_realParamValues[0], !NAN(dVar1))) {
            local_130 = 0x1c00000000;
            local_1a8.la[0] = 0;
            local_1a8.ld.data = (limb_pointer)0x0;
            local_198 = 0;
            uStack_190 = 0;
            local_188 = 0;
            pvStack_180 = (void *)0x0;
            local_178 = 0;
            uStack_170 = 0;
            local_168 = 0;
            uStack_160 = 0;
            local_158 = 0;
            uStack_150 = 0;
            local_148 = 0;
            uStack_140 = 0;
            uStack_13b = 0;
            uStack_138 = 0;
            uStack_134 = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_1a8.ld,dVar1);
            iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)&local_128.ld,
                               (cpp_dec_float<200U,_int,_void> *)&local_1a8.ld);
            pcVar8 = "infeasible";
            if (iVar4 < 1) {
              pcVar8 = "feasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar11 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar5 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar8,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          poVar11 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
               *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 0x100;
          pdVar9 = &local_128;
          pdVar10 = &local_a8;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&(pdVar10->ld).capacity)->data)._M_elems[0] =
                 (pdVar9->ld).capacity;
            pdVar9 = (data_type *)((long)pdVar9 + ((ulong)bVar12 * -2 + 1) * 4);
            pdVar10 = (data_type *)((long)pdVar10 + ((ulong)bVar12 * -2 + 1) * 4);
          }
          local_38 = local_b8;
          local_34 = local_b4;
          local_30 = CONCAT44(uStack_ac,local_b0);
          boost::multiprecision::operator<<
                    (poVar11,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_a8.ld);
          poVar11 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar6 = *(long *)poVar11;
          *(undefined8 *)(poVar11 + *(long *)(lVar6 + -0x18) + 8) = 8;
          lVar6 = *(long *)(lVar6 + -0x18);
          *(uint *)(poVar11 + lVar6 + 0x18) = *(uint *)(poVar11 + lVar6 + 0x18) & 0xfffffefb | 4;
          pcVar8 = ").\n";
          lVar6 = 3;
          goto LAB_004bbd99;
        }
      }
      VVar7 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar11 = (soplex->spxout).m_streams[3];
        pcVar8 = "Could not check primal solution.\n";
        lVar6 = 0x21;
        goto LAB_004bbd99;
      }
    }
LAB_004bbda1:
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) goto LAB_004bbdb3;
    local_240 = 0x1c00000000;
    local_2b8.la[0] = 0;
    local_2b8.ld.data = (limb_pointer)0x0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_298 = 0;
    pvStack_290 = (void *)0x0;
    local_288 = 0;
    uStack_280 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_24b = 0;
    uStack_248 = 0;
    uStack_244 = 0;
    local_2c0 = 0x1c00000000;
    local_338.la[0] = 0;
    local_338.ld.data = (limb_pointer)0x0;
    local_328 = 0;
    uStack_320 = 0;
    local_318 = 0;
    pvStack_310 = (void *)0x0;
    local_308 = 0;
    uStack_300 = 0;
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2d8 = 0;
    uStack_2d0 = 0;
    uStack_2cb = 0;
    uStack_2c8 = 0;
    uStack_2c4 = 0;
    local_1b0 = 0x1c00000000;
    local_228.la[0] = 0;
    local_228.ld.data = (limb_pointer)0x0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    pvStack_200 = (void *)0x0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1bb = 0;
    uStack_1b8 = 0;
    bVar3 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getRedCostViolation
                      (soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_2b8.ld,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_228.ld);
    if (bVar3) {
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_338.ld,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_228.ld);
      if (!bVar3) goto LAB_004bbf2c;
      VVar7 = (soplex->spxout).m_verbosity;
      if ((int)VVar7 < 3) goto LAB_004bc121;
      (soplex->spxout).m_verbosity = INFO1;
      if ((int)local_2c0 == 2 || (int)local_240 == 2) {
LAB_004bbf60:
        puVar2 = &local_2c0;
        pdVar9 = &local_338;
        pdVar10 = &local_128;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pdVar10->ld).capacity = (pdVar9->ld).capacity;
          pdVar9 = (data_type *)((long)pdVar9 + (ulong)bVar12 * -8 + 4);
          pdVar10 = (data_type *)((long)pdVar10 + ((ulong)bVar12 * -2 + 1) * 4);
        }
        local_b8 = uStack_2c8;
        local_b4 = uStack_2c4;
        local_b0 = (int)local_2c0;
      }
      else {
        iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)&local_2b8.ld,
                           (cpp_dec_float<200U,_int,_void> *)&local_338.ld);
        if (iVar4 < 1) {
          goto LAB_004bbf60;
        }
        puVar2 = &local_240;
        pdVar9 = &local_2b8;
        pdVar10 = &local_128;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pdVar10->ld).capacity = (pdVar9->ld).capacity;
          pdVar9 = (data_type *)((long)pdVar9 + (ulong)bVar12 * -8 + 4);
          pdVar10 = (data_type *)((long)pdVar10 + ((ulong)bVar12 * -2 + 1) * 4);
        }
        local_b8 = uStack_248;
        local_b4 = uStack_244;
        local_b0 = (int)local_240;
      }
      uStack_ac = *(undefined4 *)((long)puVar2 + 4);
      pcVar8 = "infeasible";
      if ((local_b0 != 2) && (dVar1 = soplex->_currentSettings->_realParamValues[1], !NAN(dVar1))) {
        local_130 = 0x1c00000000;
        local_1a8.la[0] = 0;
        local_1a8.ld.data = (limb_pointer)0x0;
        local_198 = 0;
        uStack_190 = 0;
        local_188 = 0;
        pvStack_180 = (void *)0x0;
        local_178 = 0;
        uStack_170 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_148 = 0;
        uStack_140 = 0;
        uStack_13b = 0;
        uStack_138 = 0;
        uStack_134 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_1a8.ld,dVar1);
        iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)&local_128.ld,
                           (cpp_dec_float<200U,_int,_void> *)&local_1a8.ld);
        pcVar8 = "infeasible";
        if (iVar4 < 1) {
          pcVar8 = "feasible";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
      poVar11 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      sVar5 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar8,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                 " in original problem (max. violation = ",0x27);
      poVar11 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
           *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      pdVar9 = &local_128;
      pdVar10 = &local_1a8;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&(pdVar10->ld).capacity)->data)._M_elems[0] =
             (pdVar9->ld).capacity;
        pdVar9 = (data_type *)((long)pdVar9 + ((ulong)bVar12 * -2 + 1) * 4);
        pdVar10 = (data_type *)((long)pdVar10 + ((ulong)bVar12 * -2 + 1) * 4);
      }
      uStack_138 = local_b8;
      uStack_134 = local_b4;
      local_130 = CONCAT44(uStack_ac,local_b0);
      boost::multiprecision::operator<<
                (poVar11,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1a8.ld);
      poVar11 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar6 = *(long *)poVar11;
      *(undefined8 *)(poVar11 + *(long *)(lVar6 + -0x18) + 8) = 8;
      lVar6 = *(long *)(lVar6 + -0x18);
      *(uint *)(poVar11 + lVar6 + 0x18) = *(uint *)(poVar11 + lVar6 + 0x18) & 0xfffffefb | 4;
      pcVar8 = ").\n";
      lVar6 = 3;
    }
    else {
LAB_004bbf2c:
      VVar7 = (soplex->spxout).m_verbosity;
      if ((int)VVar7 < 3) goto LAB_004bc121;
      (soplex->spxout).m_verbosity = INFO1;
      poVar11 = (soplex->spxout).m_streams[3];
      pcVar8 = "Could not check dual solution.\n";
      lVar6 = 0x1f;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar8,lVar6);
  (soplex->spxout).m_verbosity = VVar7;
LAB_004bc121:
  if (2 < (int)VVar7) {
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>((soplex->spxout).m_streams[3],"\n",1);
    (soplex->spxout).m_verbosity = VVar7;
  }
  return;
}

Assistant:

void checkSolution(SoPlexBase<R>& soplex)
{
   if(soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_RATIONAL
         || (soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_AUTO
             && soplex.intParam(SoPlexBase<R>::READMODE) == SoPlexBase<R>::READMODE_RATIONAL))
   {
      checkSolutionRational(soplex);
   }
   else
   {
      checkSolutionReal(soplex);
   }

   SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\n");
}